

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_column_writer.cpp
# Opt level: O3

void __thiscall duckdb::WriteParquetDecimal(duckdb *this,hugeint_t input,data_ptr_t result)

{
  char cVar1;
  byte bVar7;
  byte bVar11;
  char cVar13;
  byte bVar15;
  byte bVar19;
  short sVar21;
  ushort uVar22;
  ushort uVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  bool bVar29;
  byte *pbVar30;
  uint uVar31;
  undefined1 auVar32 [14];
  uint uVar33;
  ulong uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  ulong uVar39;
  undefined1 auVar40 [14];
  undefined1 auVar41 [16];
  ulong uVar42;
  ulong uVar43;
  short sVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  short sVar49;
  ulong uVar50;
  ulong uVar51;
  hugeint_t hVar52;
  hugeint_t local_68;
  hugeint_t local_50;
  hugeint_t local_40;
  hugeint_t local_30;
  byte bVar2;
  char cVar3;
  byte bVar4;
  char cVar5;
  char cVar6;
  byte bVar8;
  char cVar9;
  char cVar10;
  byte bVar12;
  char cVar14;
  byte bVar16;
  char cVar17;
  char cVar18;
  byte bVar20;
  
  pbVar30 = (byte *)input.upper;
  local_68.upper = input.lower;
  local_68.lower = (uint64_t)this;
  hugeint_t::hugeint_t(&local_50,0);
  bVar29 = hugeint_t::operator>=(&local_68,&local_50);
  if (bVar29) {
    hVar52.upper = local_68.upper;
    hVar52.lower = local_68.lower;
  }
  else {
    local_30.lower = 0xffffffffffffffff;
    local_30.upper = 0x7fffffffffffffff;
    local_50 = hugeint_t::operator+(&local_30,&local_68);
    hugeint_t::hugeint_t(&local_40,1);
    hVar52 = hugeint_t::operator+(&local_50,&local_40);
  }
  uVar31 = hVar52.upper._4_4_;
  uVar34 = hVar52.lower;
  uVar33 = (uint)DAT_01e2ef80;
  uVar35 = DAT_01e2ef80._4_4_;
  uVar39 = (ulong)DAT_01e2ef80;
  uVar36 = DAT_01e2ef80._8_4_;
  uVar37 = hVar52.upper._1_4_ & uVar33;
  uVar38 = uVar31 >> 8 & uVar35;
  uVar45 = hVar52.upper._3_4_ & uVar33;
  uVar46 = uVar31 >> 0x18 & uVar35;
  uVar47 = hVar52.upper._2_4_ & uVar36;
  uVar48 = (uint)hVar52.upper._6_2_ & DAT_01e2ef80._12_4_;
  sVar21 = (short)uVar45;
  cVar1 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar45 - (0xff < sVar21);
  sVar21 = (short)(uVar45 >> 0x10);
  sVar44 = CONCAT11((0 < sVar21) * (sVar21 < 0x100) * (char)(uVar45 >> 0x10) - (0xff < sVar21),cVar1
                   );
  uVar22 = (ushort)uVar46;
  bVar2 = (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar46 - (0xff < uVar22);
  sVar21 = (short)uVar47;
  cVar3 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar47 - (0xff < sVar21);
  sVar21 = (short)(uVar47 >> 0x10);
  sVar24 = CONCAT11((0 < sVar21) * (sVar21 < 0x100) * (char)(uVar47 >> 0x10) - (0xff < sVar21),cVar3
                   );
  sVar21 = (short)uVar48;
  bVar4 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar48 - (0xff < sVar21);
  sVar21 = (short)uVar37;
  cVar5 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar37 - (0xff < sVar21);
  sVar21 = (short)(uVar37 >> 0x10);
  sVar25 = CONCAT11((0 < sVar21) * (sVar21 < 0x100) * (char)(uVar37 >> 0x10) - (0xff < sVar21),cVar5
                   );
  sVar21 = (short)uVar38;
  cVar6 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar38 - (0xff < sVar21);
  uVar23 = (ushort)(uVar38 >> 0x10);
  uVar37 = uVar31 >> 8 & uVar33;
  uVar45 = uVar31 & uVar36;
  uVar31 = uVar31 >> 0x18 & uVar33;
  uVar36 = hVar52.upper._6_2_ & uVar36;
  uVar22 = (ushort)uVar31;
  bVar7 = (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar31 - (0xff < uVar22);
  sVar21 = (short)uVar36;
  bVar8 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar36 - (0xff < sVar21);
  sVar21 = (short)uVar37;
  cVar9 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar37 - (0xff < sVar21);
  uVar22 = (ushort)(uVar37 >> 0x10);
  uVar22 = CONCAT11((uVar22 != 0) * (uVar22 < 0x100) * (char)(uVar37 >> 0x10) - (0xff < uVar22),
                    cVar9);
  auVar32._0_12_ = ZEXT212(uVar22) << 0x40;
  sVar21 = (short)uVar45;
  cVar10 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar45 - (0xff < sVar21);
  auVar32[0xc] = cVar10;
  sVar21 = (short)(uVar45 >> 0x10);
  auVar32[0xd] = (0 < sVar21) * (sVar21 < 0x100) * (char)(uVar45 >> 0x10) - (0xff < sVar21);
  bVar7 = (bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7);
  bVar8 = (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8);
  bVar11 = (0 < (short)uVar22) * ((short)uVar22 < 0x100) * cVar9 - (0xff < (short)uVar22);
  sVar21 = auVar32._12_2_;
  bVar12 = (0 < sVar21) * (sVar21 < 0x100) * cVar10 - (0xff < sVar21);
  cVar1 = (0 < sVar44) * (sVar44 < 0x100) * cVar1 - (0xff < sVar44);
  sVar26 = CONCAT11((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2),cVar1);
  cVar3 = (0 < sVar24) * (sVar24 < 0x100) * cVar3 - (0xff < sVar24);
  uVar27 = CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),CONCAT12(cVar3,sVar26));
  cVar5 = (0 < sVar25) * (sVar25 < 0x100) * cVar5 - (0xff < sVar25);
  sVar24 = (short)(CONCAT13((uVar23 != 0) * (uVar23 < 0x100) * (char)(uVar38 >> 0x10) -
                            (0xff < uVar23),CONCAT12(cVar6,sVar25)) >> 0x10);
  auVar41._8_4_ = (int)hVar52.lower;
  auVar41._0_8_ = uVar34;
  auVar41._12_4_ = hVar52.lower._4_4_;
  uVar42 = auVar41._8_8_;
  uVar33 = hVar52.lower._1_4_ & uVar33;
  uVar35 = hVar52.lower._4_4_ >> 8 & uVar35;
  uVar50 = uVar34 >> 0x18 & uVar39;
  uVar43 = DAT_01e2ef80._8_8_;
  uVar51 = uVar42 >> 0x10 & uVar43;
  sVar21 = (short)uVar50;
  cVar9 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar50 - (0xff < sVar21);
  sVar21 = (short)(uVar50 >> 0x10);
  sVar49 = CONCAT11((0 < sVar21) * (sVar21 < 0x100) * (char)(uVar50 >> 0x10) - (0xff < sVar21),cVar9
                   );
  uVar22 = (ushort)(uVar50 >> 0x20);
  bVar2 = (uVar22 != 0) * (uVar22 < 0x100) * (char)(uVar50 >> 0x20) - (0xff < uVar22);
  sVar21 = (short)uVar51;
  cVar13 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar51 - (0xff < sVar21);
  sVar21 = (short)(uVar51 >> 0x10);
  sVar25 = CONCAT11((0 < sVar21) * (sVar21 < 0x100) * (char)(uVar51 >> 0x10) - (0xff < sVar21),
                    cVar13);
  sVar21 = (short)(uVar51 >> 0x20);
  bVar4 = (0 < sVar21) * (sVar21 < 0x100) * (char)(uVar51 >> 0x20) - (0xff < sVar21);
  sVar21 = (short)uVar33;
  cVar14 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar33 - (0xff < sVar21);
  sVar21 = (short)(uVar33 >> 0x10);
  sVar44 = CONCAT11((0 < sVar21) * (sVar21 < 0x100) * (char)(uVar33 >> 0x10) - (0xff < sVar21),
                    cVar14);
  sVar21 = (short)uVar35;
  cVar10 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar35 - (0xff < sVar21);
  uVar23 = (ushort)(uVar35 >> 0x10);
  uVar50 = uVar34 >> 0x28 & uVar39;
  uVar51 = uVar42 >> 0x20 & uVar43;
  uVar39 = uVar34 >> 0x38 & uVar39;
  uVar43 = uVar42 >> 0x30 & uVar43;
  uVar22 = (ushort)uVar39;
  bVar15 = (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar39 - (0xff < uVar22);
  sVar21 = (short)uVar43;
  bVar16 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar43 - (0xff < sVar21);
  sVar21 = (short)uVar50;
  cVar17 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar50 - (0xff < sVar21);
  uVar22 = (ushort)(uVar50 >> 0x10);
  uVar22 = CONCAT11((uVar22 != 0) * (uVar22 < 0x100) * (char)(uVar50 >> 0x10) - (0xff < uVar22),
                    cVar17);
  auVar40._0_12_ = ZEXT212(uVar22) << 0x40;
  sVar21 = (short)uVar51;
  cVar18 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar51 - (0xff < sVar21);
  auVar40[0xc] = cVar18;
  sVar21 = (short)(uVar51 >> 0x10);
  auVar40[0xd] = (0 < sVar21) * (sVar21 < 0x100) * (char)(uVar51 >> 0x10) - (0xff < sVar21);
  bVar15 = (bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15);
  bVar16 = (bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16);
  bVar19 = (0 < (short)uVar22) * ((short)uVar22 < 0x100) * cVar17 - (0xff < (short)uVar22);
  sVar21 = auVar40._12_2_;
  bVar20 = (0 < sVar21) * (sVar21 < 0x100) * cVar18 - (0xff < sVar21);
  cVar9 = (0 < sVar49) * (sVar49 < 0x100) * cVar9 - (0xff < sVar49);
  sVar49 = CONCAT11((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2),cVar9);
  cVar13 = (0 < sVar25) * (sVar25 < 0x100) * cVar13 - (0xff < sVar25);
  uVar28 = CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),CONCAT12(cVar13,sVar49))
  ;
  cVar14 = (0 < sVar44) * (sVar44 < 0x100) * cVar14 - (0xff < sVar44);
  sVar25 = (short)(CONCAT13((uVar23 != 0) * (uVar23 < 0x100) * (char)(uVar35 >> 0x10) -
                            (0xff < uVar23),CONCAT12(cVar10,sVar44)) >> 0x10);
  sVar21 = (short)((uint)uVar27 >> 0x10);
  sVar24 = (short)(CONCAT15((0 < sVar24) * (sVar24 < 0x100) * cVar6 - (0xff < sVar24),
                            CONCAT14(cVar5,uVar27)) >> 0x20);
  sVar44 = (short)((uint)uVar28 >> 0x10);
  sVar25 = (short)(CONCAT15((0 < sVar25) * (sVar25 < 0x100) * cVar10 - (0xff < sVar25),
                            CONCAT14(cVar14,uVar28)) >> 0x20);
  *pbVar30 = (bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7);
  pbVar30[1] = (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8);
  pbVar30[2] = (bVar11 != 0) * (bVar11 < 0x100) * bVar11 - (0xff < bVar11);
  pbVar30[3] = (bVar12 != 0) * (bVar12 < 0x100) * bVar12 - (0xff < bVar12);
  pbVar30[4] = (0 < sVar26) * (sVar26 < 0x100) * cVar1 - (0xff < sVar26);
  pbVar30[5] = (0 < sVar21) * (sVar21 < 0x100) * cVar3 - (0xff < sVar21);
  pbVar30[6] = (0 < sVar24) * (sVar24 < 0x100) * cVar5 - (0xff < sVar24);
  pbVar30[7] = 0;
  pbVar30[8] = (bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15);
  pbVar30[9] = (bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16);
  pbVar30[10] = (bVar19 != 0) * (bVar19 < 0x100) * bVar19 - (0xff < bVar19);
  pbVar30[0xb] = (bVar20 != 0) * (bVar20 < 0x100) * bVar20 - (0xff < bVar20);
  pbVar30[0xc] = (0 < sVar49) * (sVar49 < 0x100) * cVar9 - (0xff < sVar49);
  pbVar30[0xd] = (0 < sVar44) * (sVar44 < 0x100) * cVar13 - (0xff < sVar44);
  pbVar30[0xe] = (0 < sVar25) * (sVar25 < 0x100) * cVar14 - (0xff < sVar25);
  pbVar30[0xf] = 0;
  if (!bVar29) {
    *pbVar30 = *pbVar30 | 0x80;
  }
  return;
}

Assistant:

static void WriteParquetDecimal(hugeint_t input, data_ptr_t result) {
	bool positive = input >= 0;
	// numbers are stored as two's complement so some muckery is required
	if (!positive) {
		input = NumericLimits<hugeint_t>::Maximum() + input + 1;
	}
	uint64_t high_bytes = uint64_t(input.upper);
	uint64_t low_bytes = input.lower;

	for (idx_t i = 0; i < sizeof(uint64_t); i++) {
		auto shift_count = (sizeof(uint64_t) - i - 1) * 8;
		result[i] = (high_bytes >> shift_count) & 0xFF;
	}
	for (idx_t i = 0; i < sizeof(uint64_t); i++) {
		auto shift_count = (sizeof(uint64_t) - i - 1) * 8;
		result[sizeof(uint64_t) + i] = (low_bytes >> shift_count) & 0xFF;
	}
	if (!positive) {
		result[0] |= 0x80;
	}
}